

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O2

void __thiscall
OpenMD::basic_teebuf<char,std::char_traits<char>>::
basic_teebuf<__gnu_cxx::__normal_iterator<std::streambuf**,std::vector<std::streambuf*,std::allocator<std::streambuf*>>>>
          (basic_teebuf<char,std::char_traits<char>> *this,
          __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
          begin,__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                end)

{
  allocator_type local_19;
  
  std::streambuf::streambuf((streambuf *)this);
  *(undefined ***)this = &PTR__basic_teebuf_002bb4f8;
  std::vector<std::streambuf*,std::allocator<std::streambuf*>>::
  vector<__gnu_cxx::__normal_iterator<std::streambuf**,std::vector<std::streambuf*,std::allocator<std::streambuf*>>>,void>
            ((vector<std::streambuf*,std::allocator<std::streambuf*>> *)(this + 0x40),begin,end,
             &local_19);
  return;
}

Assistant:

basic_teebuf(ForwardIterator begin, ForwardIterator end) :
        buffers_(begin, end) {}